

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscript.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *path;
  bool bVar1;
  command *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  int iVar4;
  pointer pbVar5;
  string local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> source;
  undefined1 local_70 [8];
  syntax s;
  
  pcVar2 = xscript::util::singleton<xscript::framework::command>::instance();
  xscript::framework::command::init(pcVar2,(EVP_PKEY_CTX *)(ulong)(uint)argc);
  xscript::parser::syntax::syntax((syntax *)local_70);
  pcVar2 = xscript::util::singleton<xscript::framework::command>::instance();
  xscript::framework::command::get_source_files_abi_cxx11_(pcVar2);
  pcVar2 = xscript::util::singleton<xscript::framework::command>::instance();
  pvVar3 = xscript::framework::command::get_source_files_abi_cxx11_(pcVar2);
  s.packages._M_h._M_single_bucket =
       (__node_base_ptr)
       (pvVar3->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  path = (string *)(source.field_2._M_local_buf + 8);
  for (pbVar5 = (pvVar3->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != (pointer)s.packages._M_h._M_single_bucket; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::string(local_b0,(string *)pbVar5);
    std::__cxx11::string::string((string *)path,local_b0);
    bVar1 = xscript::parser::syntax::load((syntax *)local_70,path);
    std::__cxx11::string::~string((string *)path);
    if (!bVar1) {
      iVar4 = 1;
    }
    std::__cxx11::string::~string(local_b0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_70);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {

    command::instance().init(argc, argv);

    /*
    lgx_token_init();

    lgx_ast_t ast;
    int ast_ok = lgx_ast_init(&ast, argv[1]);
    lgx_ast_print(&ast);
    lgx_ast_print_error(&ast);

    if (ast_ok == 0) {
        lgx_compiler_t c;
        lgx_compiler_init(&c);
        int c_ok = lgx_compiler_generate(&c, &ast);

        lgx_bc_print(c.bc.buffer, c.bc.length);
        lgx_ast_print_error(&ast);
        lgx_const_print(&c.constant);
        printf("\n\n");

        if (c_ok == 0) {
            lgx_vm_t vm;
            lgx_vm_init(&vm, &c);

            // 寻找 main 函数
            lgx_str_t mainfunc = lgx_str("main");
            lgx_symbol_t* symbol = lgx_symbol_get(ast.root, &mainfunc, -1);

            if (symbol) {
                lgx_function_t* fun  = symbol->v.v.fun;
                lgx_vm_call(&vm, fun);
            } else {
                // TODO
                // can't find main func
            }

            lgx_vm_cleanup(&vm);
        }

        lgx_compiler_cleanup(&c);
    }

    lgx_ast_cleanup(&ast);

    lgx_token_cleanup();
    */

    int ret = 0;
    syntax s;
    
    if (command::instance().get_source_files().size() == 0) {
        // TODO 交互式终端模式
    }

    // 
    for (auto source : command::instance().get_source_files()) {
        if (!s.load(source)) {
            ret = 1;
        }
    }
    
    return ret;
}